

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::PrintCommandTrace
          (cmMakefile *this,cmListFileFunction *lff,cmListFileBacktrace *bt,
          CommandMissingFromStack missing)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmGeneratedFileStream *pcVar2;
  bool bVar3;
  bool bVar4;
  TraceFormat TVar5;
  cmake *pcVar6;
  cmListFileContext *pcVar7;
  long lVar8;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *pvVar9;
  size_type sVar10;
  reference __x;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  Value *pVVar11;
  long lVar12;
  long lVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  string *psVar15;
  ostream *poVar16;
  Value *root;
  double value;
  bool local_591;
  string local_588;
  string local_568 [32];
  cmGeneratedFileStream *local_548;
  cmGeneratedFileStream *f;
  string *arg_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  Value local_500;
  Value local_4d8;
  Value local_4b0;
  Value local_488;
  String *local_460;
  string *arg_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  Value local_418;
  Value local_3f0;
  Value local_3c8;
  Value local_3a0;
  Value local_378;
  allocator<char> local_349;
  String local_348;
  Value local_328;
  undefined1 local_300 [8];
  StreamWriterBuilder builder;
  Value val;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *deferId;
  cmListFileArgument *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *__range1;
  undefined1 local_278 [7];
  bool expand;
  string temp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream msg;
  string local_b0;
  long local_90;
  size_type pos;
  string *file;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_60 [7];
  bool trace;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string *only_filename;
  string *full_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *trace_only_this_files;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> *pcStack_20;
  CommandMissingFromStack missing_local;
  cmListFileBacktrace *bt_local;
  cmListFileFunction *lff_local;
  cmMakefile *this_local;
  
  trace_only_this_files._4_4_ = missing;
  pcStack_20 = &bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>;
  bt_local = (cmListFileBacktrace *)lff;
  lff_local = (cmListFileFunction *)this;
  pcVar6 = GetCMakeInstance(this);
  full_path = (string *)cmake::GetTraceSources_abi_cxx11_(pcVar6);
  pcVar7 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top(pcStack_20);
  only_filename = &pcVar7->FilePath;
  cmsys::SystemTools::GetFilenameName((string *)local_60,only_filename);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
  __range2._7_1_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)full_path);
  psVar15 = full_path;
  if (!__range2._7_1_) {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)full_path);
    file = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)psVar15);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&file), bVar3) {
      pos = (size_type)
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end2);
      lVar12 = std::__cxx11::string::rfind((string *)only_filename,pos);
      bVar3 = false;
      local_591 = false;
      local_90 = lVar12;
      if (lVar12 != -1) {
        lVar13 = std::__cxx11::string::size();
        lVar8 = std::__cxx11::string::size();
        pbVar14 = local_40;
        local_591 = false;
        if (lVar12 + lVar13 == lVar8) {
          cmsys::SystemTools::GetFilenameName(&local_b0,(string *)pos);
          bVar3 = true;
          local_591 = std::operator==(pbVar14,&local_b0);
        }
      }
      __range2._7_1_ = local_591;
      if (bVar3) {
        std::__cxx11::string::~string((string *)&local_b0);
      }
      if (local_591 != false) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    if (__range2._7_1_ == false) goto LAB_004927ed;
  }
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)
             &args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&temp.field_2 + 8));
  std::__cxx11::string::string((string *)local_278);
  pcVar6 = GetCMakeInstance(this);
  bVar3 = cmake::GetTraceExpand(pcVar6);
  pvVar9 = cmListFileFunction::Arguments((cmListFileFunction *)bt_local);
  sVar10 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size(pvVar9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&temp.field_2 + 8),sVar10);
  pvVar9 = cmListFileFunction::Arguments((cmListFileFunction *)bt_local);
  __end1 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin(pvVar9);
  arg = (cmListFileArgument *)
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end(pvVar9);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                                     *)&arg), bVar4) {
    __x = __gnu_cxx::
          __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
          ::operator*(&__end1);
    if ((bVar3) && (__x->Delim != Bracket)) {
      std::__cxx11::string::operator=((string *)local_278,(string *)__x);
      ExpandVariablesInString(this,(string *)local_278);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&temp.field_2 + 8),(value_type *)local_278);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&temp.field_2 + 8),&__x->Value);
    }
    __gnu_cxx::
    __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
    ::operator++(&__end1);
  }
  pcVar7 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top(pcStack_20);
  this_00 = &pcVar7->DeferId;
  pcVar6 = GetCMakeInstance(this);
  TVar5 = cmake::GetTraceFormat(pcVar6);
  if (TVar5 == Undefined) {
    std::operator<<((ostream *)
                    &args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    "INTERNAL ERROR: Trace format is Undefined");
  }
  else if (TVar5 == Human) {
    poVar16 = std::operator<<((ostream *)
                              &args.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (string *)only_filename);
    poVar16 = std::operator<<(poVar16,"(");
    lVar12 = cmListFileFunction::Line((cmListFileFunction *)bt_local);
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,lVar12);
    std::operator<<(poVar16,"):");
    bVar3 = std::optional::operator_cast_to_bool((optional *)this_00);
    if (bVar3) {
      poVar16 = std::operator<<((ostream *)
                                &args.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,"DEFERRED:");
      pbVar14 = std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(this_00);
      poVar16 = std::operator<<(poVar16,(string *)pbVar14);
      std::operator<<(poVar16,":");
    }
    poVar16 = std::operator<<((ostream *)
                              &args.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,"  ");
    psVar15 = cmListFileFunction::OriginalName_abi_cxx11_((cmListFileFunction *)bt_local);
    poVar16 = std::operator<<(poVar16,(string *)psVar15);
    std::operator<<(poVar16,"(");
    pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&temp.field_2 + 8);
    __end2_2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar1);
    arg_2 = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(pvVar1);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&arg_2), bVar3) {
      f = (cmGeneratedFileStream *)
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2_2);
      poVar16 = std::operator<<((ostream *)
                                &args.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)f);
      std::operator<<(poVar16," ");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_2);
    }
    std::operator<<((ostream *)
                    &args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,")");
  }
  else if (TVar5 == JSONv1) {
    Json::Value::Value((Value *)&builder.settings_.limit_,nullValue);
    Json::StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)local_300);
    Json::Value::Value(&local_328,"");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"indentation",&local_349);
    pVVar11 = Json::StreamWriterBuilder::operator[]((StreamWriterBuilder *)local_300,&local_348);
    Json::Value::operator=(pVVar11,&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
    Json::Value::~Value(&local_328);
    Json::Value::Value(&local_378,only_filename);
    pVVar11 = Json::Value::operator[]((Value *)&builder.settings_.limit_,"file");
    Json::Value::operator=(pVVar11,&local_378);
    Json::Value::~Value(&local_378);
    lVar12 = cmListFileFunction::Line((cmListFileFunction *)bt_local);
    Json::Value::Value(&local_3a0,lVar12);
    pVVar11 = Json::Value::operator[]((Value *)&builder.settings_.limit_,"line");
    Json::Value::operator=(pVVar11,&local_3a0);
    Json::Value::~Value(&local_3a0);
    lVar12 = cmListFileFunction::Line((cmListFileFunction *)bt_local);
    lVar13 = cmListFileFunction::LineEnd((cmListFileFunction *)bt_local);
    if (lVar12 != lVar13) {
      lVar12 = cmListFileFunction::LineEnd((cmListFileFunction *)bt_local);
      Json::Value::Value(&local_3c8,lVar12);
      pVVar11 = Json::Value::operator[]((Value *)&builder.settings_.limit_,"line_end");
      Json::Value::operator=(pVVar11,&local_3c8);
      Json::Value::~Value(&local_3c8);
    }
    bVar3 = std::optional::operator_cast_to_bool((optional *)this_00);
    if (bVar3) {
      pbVar14 = std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(this_00);
      Json::Value::Value(&local_3f0,pbVar14);
      pVVar11 = Json::Value::operator[]((Value *)&builder.settings_.limit_,"defer");
      Json::Value::operator=(pVVar11,&local_3f0);
      Json::Value::~Value(&local_3f0);
    }
    psVar15 = cmListFileFunction::OriginalName_abi_cxx11_((cmListFileFunction *)bt_local);
    Json::Value::Value(&local_418,psVar15);
    pVVar11 = Json::Value::operator[]((Value *)&builder.settings_.limit_,"cmd");
    Json::Value::operator=(pVVar11,&local_418);
    Json::Value::~Value(&local_418);
    Json::Value::Value((Value *)&__range2_1,arrayValue);
    pVVar11 = Json::Value::operator[]((Value *)&builder.settings_.limit_,"args");
    Json::Value::operator=(pVVar11,(Value *)&__range2_1);
    Json::Value::~Value((Value *)&__range2_1);
    pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&temp.field_2 + 8);
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar1);
    arg_1 = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(pvVar1);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&arg_1), bVar3) {
      local_460 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
      pVVar11 = Json::Value::operator[]((Value *)&builder.settings_.limit_,"args");
      Json::Value::Value(&local_488,local_460);
      Json::Value::append(pVVar11,&local_488);
      Json::Value::~Value(&local_488);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    value = cmsys::SystemTools::GetTime();
    Json::Value::Value(&local_4b0,value);
    pVVar11 = Json::Value::operator[]((Value *)&builder.settings_.limit_,"time");
    Json::Value::operator=(pVVar11,&local_4b0);
    Json::Value::~Value(&local_4b0);
    bVar3 = trace_only_this_files._4_4_ == Yes;
    sVar10 = std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::size
                       (&this->ExecutionStatusStack);
    Json::Value::Value(&local_4d8,bVar3 + sVar10);
    pVVar11 = Json::Value::operator[]((Value *)&builder.settings_.limit_,"frame");
    Json::Value::operator=(pVVar11,&local_4d8);
    Json::Value::~Value(&local_4d8);
    root = (Value *)(ulong)(trace_only_this_files._4_4_ == Yes);
    Json::Value::Value(&local_500,(ulong)(trace_only_this_files._4_4_ == Yes) + this->RecursionDepth
                      );
    pVVar11 = Json::Value::operator[]((Value *)&builder.settings_.limit_,"global_frame");
    Json::Value::operator=(pVVar11,&local_500);
    Json::Value::~Value(&local_500);
    Json::writeString_abi_cxx11_
              ((String *)&__range2_2,(Json *)local_300,(Factory *)&builder.settings_.limit_,root);
    std::operator<<((ostream *)
                    &args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&__range2_2);
    std::__cxx11::string::~string((string *)&__range2_2);
    Json::StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)local_300);
    Json::Value::~Value((Value *)&builder.settings_.limit_);
  }
  pcVar6 = GetCMakeInstance(this);
  local_548 = cmake::GetTraceFile(pcVar6);
  bVar3 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&(local_548->super_ofstream).
                                    super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream +
                            (long)(local_548->super_ofstream).
                                  super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream[-3]));
  pcVar2 = local_548;
  if (bVar3) {
    std::__cxx11::ostringstream::str();
    poVar16 = std::operator<<((ostream *)pcVar2,local_568);
    std::operator<<(poVar16,'\n');
    std::__cxx11::string::~string(local_568);
  }
  else {
    std::__cxx11::ostringstream::str();
    cmSystemTools::Message(&local_588,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_588);
  }
  std::__cxx11::string::~string((string *)local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&temp.field_2 + 8));
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_004927ed:
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(cmListFileFunction const& lff,
                                   cmListFileBacktrace const& bt,
                                   CommandMissingFromStack missing) const
{
  // Check if current file in the list of requested to trace...
  std::vector<std::string> const& trace_only_this_files =
    this->GetCMakeInstance()->GetTraceSources();
  std::string const& full_path = bt.Top().FilePath;
  std::string const& only_filename = cmSystemTools::GetFilenameName(full_path);
  bool trace = trace_only_this_files.empty();
  if (!trace) {
    for (std::string const& file : trace_only_this_files) {
      std::string::size_type const pos = full_path.rfind(file);
      trace = (pos != std::string::npos) &&
        ((pos + file.size()) == full_path.size()) &&
        (only_filename == cmSystemTools::GetFilenameName(file));
      if (trace) {
        break;
      }
    }
    // Do nothing if current file wasn't requested for trace...
    if (!trace) {
      return;
    }
  }

  std::ostringstream msg;
  std::vector<std::string> args;
  std::string temp;
  bool expand = this->GetCMakeInstance()->GetTraceExpand();

  args.reserve(lff.Arguments().size());
  for (cmListFileArgument const& arg : lff.Arguments()) {
    if (expand && arg.Delim != cmListFileArgument::Bracket) {
      temp = arg.Value;
      this->ExpandVariablesInString(temp);
      args.push_back(temp);
    } else {
      args.push_back(arg.Value);
    }
  }
  cm::optional<std::string> const& deferId = bt.Top().DeferId;

  switch (this->GetCMakeInstance()->GetTraceFormat()) {
    case cmake::TraceFormat::JSONv1: {
#ifndef CMAKE_BOOTSTRAP
      Json::Value val;
      Json::StreamWriterBuilder builder;
      builder["indentation"] = "";
      val["file"] = full_path;
      val["line"] = static_cast<Json::Value::Int64>(lff.Line());
      if (lff.Line() != lff.LineEnd()) {
        val["line_end"] = static_cast<Json::Value::Int64>(lff.LineEnd());
      }
      if (deferId) {
        val["defer"] = *deferId;
      }
      val["cmd"] = lff.OriginalName();
      val["args"] = Json::Value(Json::arrayValue);
      for (std::string const& arg : args) {
        val["args"].append(arg);
      }
      val["time"] = cmSystemTools::GetTime();
      val["frame"] = (missing == CommandMissingFromStack::Yes ? 1 : 0) +
        static_cast<Json::Value::UInt64>(this->ExecutionStatusStack.size());
      val["global_frame"] = (missing == CommandMissingFromStack::Yes ? 1 : 0) +
        static_cast<Json::Value::UInt64>(this->RecursionDepth);
      msg << Json::writeString(builder, val);
#endif
      break;
    }
    case cmake::TraceFormat::Human:
      msg << full_path << "(" << lff.Line() << "):";
      if (deferId) {
        msg << "DEFERRED:" << *deferId << ":";
      }
      msg << "  " << lff.OriginalName() << "(";

      for (std::string const& arg : args) {
        msg << arg << " ";
      }
      msg << ")";
      break;
    case cmake::TraceFormat::Undefined:
      msg << "INTERNAL ERROR: Trace format is Undefined";
      break;
  }

  auto& f = this->GetCMakeInstance()->GetTraceFile();
  if (f) {
    f << msg.str() << '\n';
  } else {
    cmSystemTools::Message(msg.str());
  }
}